

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::parse_prelude_literal(Parser *this)

{
  int iVar1;
  _Head_base<0UL,_TextProvider_*,_false> _Var2;
  byte bVar3;
  bool bVar4;
  string current_literal_string;
  string asStack_88 [32];
  string local_68 [32];
  undefined1 local_48 [40];
  int local_20;
  
  std::__cxx11::string::string<std::allocator<char>>(asStack_88,"",(allocator<char> *)local_48);
  if (((this->m_text_provider)._M_t.
       super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t.
       super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
       super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->m_current_char != ' ') {
    std::__cxx11::string::push_back((char)asStack_88);
  }
  bVar4 = false;
  while( true ) {
    bVar3 = (**(code **)((long)((this->m_text_provider)._M_t.
                                super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                                .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                               _vptr_TextProvider + 0x10))();
    if (bVar4 != false || (~bVar3 & 1) != 0) break;
    (**(code **)((long)((this->m_text_provider)._M_t.
                        super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t
                        .super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
                        super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                       _vptr_TextProvider + 0x18))();
    bVar4 = try_parse_return(this,false);
    _Var2._M_head_impl =
         (this->m_text_provider)._M_t.
         super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t.
         super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
         super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl;
    if (bVar4) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_TextProvider + 0x20))();
    }
    else if ((_Var2._M_head_impl)->m_current_char == '(') {
      parse_comment(this,0);
    }
    else {
      std::__cxx11::string::push_back((char)asStack_88);
    }
  }
  std::__cxx11::string::string(local_68,asStack_88);
  iVar1 = this->m_line_counter;
  local_48._0_4_ = Literal;
  std::__cxx11::string::string((string *)(local_48 + 8),local_68);
  local_20 = iVar1;
  std::
  vector<Token<ParsedGame::PreludeTokenType>,std::allocator<Token<ParsedGame::PreludeTokenType>>>::
  emplace_back<Token<ParsedGame::PreludeTokenType>>
            ((vector<Token<ParsedGame::PreludeTokenType>,std::allocator<Token<ParsedGame::PreludeTokenType>>>
              *)&this->m_parsed_game,(Token<ParsedGame::PreludeTokenType> *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(asStack_88);
  return;
}

Assistant:

void Parser::parse_prelude_literal()
{
	string current_literal_string = "";
	if(m_text_provider->get_current_char() != ' ')
	{
		current_literal_string.push_back(m_text_provider->get_current_char());
	}

	bool detected_literal_end = false;
	while(m_text_provider->is_valid() && !detected_literal_end)
	{
		m_text_provider->advance();
		if(try_parse_return(false))
		{
			detected_literal_end = true;
			m_text_provider->reverse();
		}
		else
		{
			switch(m_text_provider->get_current_char())
			{
				case '(':
					parse_comment();
					break;
				default:
					current_literal_string.push_back(m_text_provider->get_current_char());
				break;
			}
		}
	}

	m_parsed_game.prelude_tokens.push_back(Token<ParsedGame::PreludeTokenType>(ParsedGame::PreludeTokenType::Literal,current_literal_string, m_line_counter));
}